

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O0

int QTest::qExec(QObject *testObject,QStringList *arguments)

{
  int iVar1;
  qsizetype qVar2;
  char *pcVar3;
  Data *pDVar4;
  QList<QString> *in_RSI;
  undefined8 in_RDI;
  int argc_00;
  long in_FS_OFFSET;
  int i;
  int argc;
  QList<QByteArray> args;
  QVarLengthArray<char_*,_256LL> argv;
  QList<QByteArray> *in_stack_fffffffffffff728;
  QVarLengthArray<char_*,_256LL> *in_stack_fffffffffffff730;
  qsizetype in_stack_fffffffffffff738;
  undefined4 in_stack_fffffffffffff740;
  undefined4 in_stack_fffffffffffff744;
  QString *in_stack_fffffffffffff748;
  int local_890;
  QList<QByteArray> *in_stack_fffffffffffff778;
  char *in_stack_fffffffffffff7b8;
  QVLABase<char_*> local_820 [86];
  long local_8;
  
  argc_00 = (int)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = QList<QString>::size(in_RSI);
  iVar1 = (int)qVar2;
  memset(local_820,0xaa,0x818);
  QVarLengthArray<char_*,_256LL>::QVarLengthArray
            ((QVarLengthArray<char_*,_256LL> *)
             CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),in_stack_fffffffffffff738
            );
  QList<QByteArray>::QList((QList<QByteArray> *)0x151a12);
  QList<QByteArray>::reserve(in_stack_fffffffffffff778,(qsizetype)in_stack_fffffffffffff7b8);
  for (local_890 = 0; local_890 < iVar1; local_890 = local_890 + 1) {
    QList<QString>::at((QList<QString> *)in_stack_fffffffffffff730,
                       (qsizetype)in_stack_fffffffffffff728);
    QString::toLocal8Bit(in_stack_fffffffffffff748);
    pcVar3 = QByteArray::constData((QByteArray *)0x151a61);
    QByteArray::QByteArray((QByteArray *)&stack0xfffffffffffff7b0,pcVar3,-1);
    QList<QByteArray>::append
              ((QList<QByteArray> *)in_stack_fffffffffffff730,(rvalue_ref)in_stack_fffffffffffff728)
    ;
    QByteArray::~QByteArray((QByteArray *)0x151a9e);
    QByteArray::~QByteArray((QByteArray *)0x151aa8);
    QList<QByteArray>::last(in_stack_fffffffffffff728);
    pDVar4 = (Data *)QByteArray::data((QByteArray *)in_stack_fffffffffffff730);
    in_stack_fffffffffffff748 =
         (QString *)
         QVLABase<char_*>::operator[]((QVLABase<char_*> *)in_stack_fffffffffffff728,0x151adf);
    (in_stack_fffffffffffff748->d).d = pDVar4;
  }
  QVLABase<char_*>::data(local_820);
  iVar1 = qExec((QObject *)CONCAT44(in_stack_fffffffffffff744,iVar1),argc_00,
                (char **)in_stack_fffffffffffff730);
  QList<QByteArray>::~QList((QList<QByteArray> *)0x151b9c);
  QVarLengthArray<char_*,_256LL>::~QVarLengthArray(in_stack_fffffffffffff730);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QTest::qExec(QObject *testObject, const QStringList &arguments)
{
    const int argc = arguments.size();
    QVarLengthArray<char *> argv(argc);

    QList<QByteArray> args;
    args.reserve(argc);

    for (int i = 0; i < argc; ++i)
    {
        args.append(arguments.at(i).toLocal8Bit().constData());
        argv[i] = args.last().data();
    }

    return qExec(testObject, argc, argv.data());
}